

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O3

int sndio_enumerate_devices
              (cubeb_conflict2 *context,cubeb_device_type type,cubeb_device_collection *collection)

{
  int iVar1;
  cubeb_device_info *pcVar2;
  
  pcVar2 = (cubeb_device_info *)malloc(0x58);
  if (pcVar2 == (cubeb_device_info *)0x0) {
    iVar1 = -1;
  }
  else {
    pcVar2->devid = sndio_enumerate_devices::dev;
    pcVar2->device_id = sndio_enumerate_devices::dev;
    pcVar2->friendly_name = sndio_enumerate_devices::dev;
    pcVar2->group_id = sndio_enumerate_devices::dev;
    pcVar2->vendor_name = (char *)0x0;
    pcVar2->type = type;
    pcVar2->state = CUBEB_DEVICE_STATE_ENABLED;
    pcVar2->preferred = CUBEB_DEVICE_PREF_ALL;
    pcVar2->format = CUBEB_DEVICE_FMT_S16LE;
    pcVar2->default_format = CUBEB_DEVICE_FMT_S16LE;
    pcVar2->max_channels = 0x10;
    pcVar2->default_rate = 48000;
    pcVar2->max_rate = 0x2ee00;
    pcVar2->min_rate = 4000;
    pcVar2->latency_lo = 0x1e0;
    pcVar2->latency_hi = 0x2580;
    collection->device = pcVar2;
    collection->count = 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
sndio_enumerate_devices(cubeb *context, cubeb_device_type type,
	cubeb_device_collection *collection)
{
  static char dev[] = SIO_DEVANY;
  cubeb_device_info *device;

  device = malloc(sizeof(cubeb_device_info));
  if (device == NULL)
    return CUBEB_ERROR;

  device->devid = dev;		/* passed to stream_init() */
  device->device_id = dev;	/* printable in UI */
  device->friendly_name = dev;	/* same, but friendly */
  device->group_id = dev;	/* actual device if full-duplex */
  device->vendor_name = NULL;   /* may be NULL */
  device->type = type;		/* Input/Output */
  device->state = CUBEB_DEVICE_STATE_ENABLED;
  device->preferred = CUBEB_DEVICE_PREF_ALL;
  device->format = CUBEB_DEVICE_FMT_S16NE;
  device->default_format = CUBEB_DEVICE_FMT_S16NE;
  device->max_channels = 16;
  device->default_rate = 48000;
  device->min_rate = 4000;
  device->max_rate = 192000;
  device->latency_lo = 480;
  device->latency_hi = 9600;
  collection->device = device;
  collection->count = 1;
  return CUBEB_OK;
}